

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall xray_re::xr_bone::save_data(xr_bone *this,xr_writer *w)

{
  long lVar1;
  float local_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  xr_writer::open_chunk(w,2);
  xr_writer::w_sz(w,&this->m_name);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,4);
  xr_writer::w_sz(w,&this->m_gamemtl);
  xr_writer::close_chunk(w);
  lVar1 = 0;
  xr_writer::w_raw_chunk(w,5,&this->m_shape,0x70,false);
  xr_writer::w_raw_chunk(w,8,&(this->m_joint_ik_data).ik_flags,4,false);
  xr_writer::open_chunk(w,6);
  local_3c = (float)(this->m_joint_ik_data).type;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  do {
    local_3c = -*(float *)((long)&(this->m_joint_ik_data).limits[0].limit.field_0 + lVar1 + 4);
    local_38 = -*(float *)((long)&(this->m_joint_ik_data).limits[0].limit.field_0 + lVar1);
    uStack_34 = 0x80000000;
    uStack_30 = 0x80000000;
    uStack_2c = 0x80000000;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = local_38;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = *(float *)((long)&(this->m_joint_ik_data).limits[0].spring_factor + lVar1);
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = *(float *)((long)&(this->m_joint_ik_data).limits[0].damping_factor + lVar1);
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  local_3c = (this->m_joint_ik_data).spring_factor;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c = (this->m_joint_ik_data).damping_factor;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,9);
  local_3c = (this->m_joint_ik_data).break_force;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c = (this->m_joint_ik_data).break_torque;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,0x10,&(this->m_joint_ik_data).friction,4,false);
  xr_writer::open_chunk(w,7);
  local_3c = this->m_mass;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c = (this->m_center_of_mass).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c = (this->m_center_of_mass).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c = (this->m_center_of_mass).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_bone::save_data(xr_writer& w) const
{
	w.w_chunk(BONE_CHUNK_DEF, m_name);	// second type!!!
	w.w_chunk(BONE_CHUNK_MATERIAL, m_gamemtl);
	w.w_chunk<s_bone_shape>(BONE_CHUNK_SHAPE, m_shape);
	w.w_chunk<uint32_t>(BONE_CHUNK_IK_FLAGS, m_joint_ik_data.ik_flags);

	w.open_chunk(BONE_CHUNK_IK_JOINT);
	w.w_u32(m_joint_ik_data.type);

	//w.w_cseq<s_joint_limit>(3, m_joint_ik_data.limits);
	for (int i = 0; i < 3; ++i) //invert limits for AE
	{
		fvector2 vec = m_joint_ik_data.limits[i].limit;
		float tmp = vec.x;
		vec.x = -vec.y;
		vec.y = -tmp;
		w.w_fvector2(vec);
		w.w_float(m_joint_ik_data.limits[i].spring_factor);
		w.w_float(m_joint_ik_data.limits[i].damping_factor);
	}

	w.w_float(m_joint_ik_data.spring_factor);
	w.w_float(m_joint_ik_data.damping_factor);
	w.close_chunk();

	w.open_chunk(BONE_CHUNK_BREAK_PARAMS);
	w.w_float(m_joint_ik_data.break_force);
	w.w_float(m_joint_ik_data.break_torque);
	w.close_chunk();

	w.w_chunk<float>(BONE_CHUNK_FRICTION, m_joint_ik_data.friction);

	w.open_chunk(BONE_CHUNK_MASS_PARAMS);
	w.w_float(m_mass);
	w.w_fvector3(m_center_of_mass);
	w.close_chunk();
}